

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O3

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  cs_detail *pcVar1;
  cs_insn *pcVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  x86_reg xVar8;
  ulong uVar9;
  uint8_t uVar10;
  undefined *puVar11;
  uint8_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  DisassemblerMode mode;
  long lVar15;
  OperandSpecifier *pOVar16;
  bool bVar17;
  reader_info info;
  InternalInstruction local_190;
  uint8_t *local_48;
  size_t local_40;
  uint64_t local_38;
  
  local_48 = code;
  local_40 = code_len;
  local_38 = address;
  memset(&local_190,0,0x98);
  pcVar1 = instr->flat_insn->detail;
  if (pcVar1 != (cs_detail *)0x0) {
    (pcVar1->field_6).x86.op_count = '\0';
    (instr->flat_insn->detail->field_6).x86.sse_cc = X86_SSE_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_cc = X86_AVX_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_sae = false;
    (instr->flat_insn->detail->field_6).x86.avx_rm = X86_AVX_RM_INVALID;
    (instr->flat_insn->detail->field_6).arm64.cc = ARM64_CC_INVALID;
    (instr->flat_insn->detail->field_6).arm.vector_size = 0;
    memset((void *)((long)&instr->flat_insn->detail->field_6 + 0x30),0,0x180);
  }
  mode = ((*(uint *)(ud + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(ud + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar4 = decodeInstruction(&local_190,reader,&local_48,address,mode);
  if (iVar4 == 0) {
    *size = (uint16_t)local_190.length;
    if (local_190.spec != (InstructionSpecifier *)0x0) {
      MCInst_setOpcode(instr,(uint)local_190.instructionID);
      if (local_190.xAcquireRelease == true) {
        uVar5 = MCInst_getOpcode(instr);
        uVar6 = 0x186f;
        if (uVar5 != 0x943) {
          uVar5 = MCInst_getOpcode(instr);
          uVar6 = 0x1828;
          if (uVar5 != 0x93b) goto LAB_0019deec;
        }
        MCInst_setOpcode(instr,uVar6);
      }
LAB_0019deec:
      local_190.numImmediatesTranslated = 0;
      lVar15 = 0;
      do {
        uVar10 = local_190.operands[lVar15].encoding;
        if (uVar10 != '\0') {
          pOVar16 = local_190.operands + lVar15;
LAB_0019df1c:
          switch(uVar10) {
          case '\x01':
            uVar14 = (ulong)local_190.reg;
LAB_0019e052:
            puVar12 = &DAT_001eb270;
LAB_0019e731:
            uVar5 = (uint)puVar12[uVar14];
LAB_0019e738:
            MCOperand_CreateReg0(instr,uVar5);
            break;
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
            switch(pOVar16->type) {
            case '\b':
            case '\t':
            case '\n':
            case '\v':
            case '9':
            case ':':
            case ';':
            case '<':
            case '=':
            case '>':
            case '?':
            case '@':
            case 'A':
            case 'B':
            case 'E':
            case 'F':
            case 'K':
            case 'L':
            case 'N':
              if (local_190.eaBase == EA_BASE_sib) {
                return false;
              }
              if (local_190.eaBase == EA_BASE_sib64) {
                return false;
              }
              if (0xd2 < local_190.eaBase - EA_REG_AL) {
                return false;
              }
              uVar5 = *(uint *)(&DAT_001ea81c + (ulong)(local_190.eaBase - EA_REG_AL) * 4);
              goto LAB_0019e738;
            default:
              return false;
            case '\x16':
            case '\x17':
            case '\x18':
            case '\x19':
            case '\x1a':
            case '\x1b':
            case '\x1c':
            case '\x1d':
            case '\x1e':
            case '\x1f':
            case ' ':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case 'M':
            case 'V':
              switch(local_190.eaBase) {
              case EA_BASE_NONE:
                if (local_190.eaDisplacement == EA_DISP_NONE) {
                  return false;
                }
                if (local_190.mode == MODE_64BIT) {
                  if (local_190.prefix3 == 'g') {
                    uVar5 = 0x1a;
                  }
                  else {
                    uVar5 = 0x29;
                  }
                  break;
                }
                uVar5 = 0;
                MCOperand_CreateReg0(instr,0);
                uVar14 = 1;
                goto LAB_0019e704;
              case EA_BASE_BX_SI:
                uVar5 = 8;
                goto LAB_0019e5fc;
              case EA_BASE_BX_DI:
                uVar5 = 8;
                goto LAB_0019e57b;
              case EA_BASE_BP_SI:
                uVar5 = 6;
LAB_0019e5fc:
                MCOperand_CreateReg0(instr,uVar5);
                uVar14 = 1;
                uVar5 = 0x2d;
                goto LAB_0019e704;
              case EA_BASE_BP_DI:
                uVar5 = 6;
LAB_0019e57b:
                MCOperand_CreateReg0(instr,uVar5);
                uVar14 = 1;
                uVar5 = 0xe;
                goto LAB_0019e704;
              case EA_BASE_SI:
                uVar5 = 0x2d;
                break;
              case EA_BASE_DI:
                uVar5 = 0xe;
                break;
              case EA_BASE_BP:
                uVar5 = 6;
                break;
              case EA_BASE_BX:
                uVar5 = 8;
                break;
              case EA_BASE_R8W:
                uVar5 = 0xe2;
                break;
              case EA_BASE_R9W:
                uVar5 = 0xe3;
                break;
              case EA_BASE_R10W:
                uVar5 = 0xe4;
                break;
              case EA_BASE_R11W:
                uVar5 = 0xe5;
                break;
              case EA_BASE_R12W:
                uVar5 = 0xe6;
                break;
              case EA_BASE_R13W:
                uVar5 = 0xe7;
                break;
              case EA_BASE_R14W:
                uVar5 = 0xe8;
                break;
              case EA_BASE_R15W:
                uVar5 = 0xe9;
                break;
              case EA_BASE_EAX:
                uVar5 = 0x13;
                break;
              case EA_BASE_ECX:
                uVar5 = 0x16;
                break;
              case EA_BASE_EDX:
                uVar5 = 0x18;
                break;
              case EA_BASE_EBX:
                uVar5 = 0x15;
                break;
              case EA_BASE_sib:
              case EA_BASE_sib64:
                if (0x20 < (ulong)local_190.sibBase) {
                  return false;
                }
                MCOperand_CreateReg0(instr,*(uint *)(&DAT_001eab68 + (ulong)local_190.sibBase * 4));
                uVar5 = MCInst_getOpcode(instr);
                if (((uVar5 - 0xeea < 0x14) && ((0xfc03fU >> (uVar5 - 0xeea & 0x1f) & 1) != 0)) ||
                   (uVar5 - 0x13e2 < 0xc)) {
                  iVar4 = 0x71;
                  if (((0xe < uVar5 - 0xeee) || ((0x4801U >> (uVar5 - 0xeee & 0x1f) & 1) == 0)) &&
                     ((9 < uVar5 - 0x13e3 || ((0x241U >> (uVar5 - 0x13e3 & 0x1f) & 1) == 0)))) {
                    iVar4 = (uint)(((uVar5 == 0x13e8 || uVar5 == 0x13eb) ||
                                   (uVar5 & 0xfffffffb) == 0x13e2) ||
                                  ((uVar5 == 0xef8 || uVar5 == 0xeed) ||
                                  (uVar5 & 0xffffffef) == 0xeeb)) * 0x20 + 0x31;
                  }
                  iVar7 = 4;
                  if (local_190.sibIndex != SIB_INDEX_NONE) {
                    iVar7 = (uint)(local_190.addressSize != '\b') * 0x10 + local_190.sibIndex +
                            -0x21;
                  }
                  local_190.sibIndex = iVar7 + iVar4;
                }
                if (local_190.sibIndex == SIB_INDEX_NONE) {
                  uVar5 = 0;
                }
                else {
                  if (0x7f < local_190.sibIndex - SIB_INDEX_EAX) {
                    return false;
                  }
                  uVar5 = *(uint *)(&DAT_001eabec + (ulong)(local_190.sibIndex - SIB_INDEX_EAX) * 4)
                  ;
                }
                uVar14 = (ulong)local_190.sibScale;
                goto LAB_0019e704;
              case EA_BASE_EBP:
                uVar5 = 0x14;
                break;
              case EA_BASE_ESI:
                uVar5 = 0x1d;
                break;
              case EA_BASE_EDI:
                uVar5 = 0x17;
                break;
              case EA_BASE_R8D:
                uVar5 = 0xda;
                break;
              case EA_BASE_R9D:
                uVar5 = 0xdb;
                break;
              case EA_BASE_R10D:
                uVar5 = 0xdc;
                break;
              case EA_BASE_R11D:
                uVar5 = 0xdd;
                break;
              case EA_BASE_R12D:
                uVar5 = 0xde;
                break;
              case EA_BASE_R13D:
                uVar5 = 0xdf;
                break;
              case EA_BASE_R14D:
                uVar5 = 0xe0;
                break;
              case EA_BASE_R15D:
                uVar5 = 0xe1;
                break;
              case EA_BASE_RAX:
                uVar5 = 0x23;
                break;
              case EA_BASE_RCX:
                uVar5 = 0x26;
                break;
              case EA_BASE_RDX:
                uVar5 = 0x28;
                break;
              case EA_BASE_RBX:
                uVar5 = 0x25;
                break;
              case EA_BASE_RBP:
                uVar5 = 0x24;
                break;
              case EA_BASE_RSI:
                uVar5 = 0x2b;
                break;
              case EA_BASE_RDI:
                uVar5 = 0x27;
                break;
              case EA_BASE_R8:
                uVar5 = 0x62;
                break;
              case EA_BASE_R9:
                uVar5 = 99;
                break;
              case EA_BASE_R10:
                uVar5 = 100;
                break;
              case EA_BASE_R11:
                uVar5 = 0x65;
                break;
              case EA_BASE_R12:
                uVar5 = 0x66;
                break;
              case EA_BASE_R13:
                uVar5 = 0x67;
                break;
              case EA_BASE_R14:
                uVar5 = 0x68;
                break;
              case EA_BASE_R15:
                uVar5 = 0x69;
                break;
              default:
                goto switchD_0019df63_caseD_c;
              }
              MCOperand_CreateReg0(instr,uVar5);
              uVar14 = 1;
              uVar5 = 0;
LAB_0019e704:
              MCOperand_CreateImm0(instr,uVar14);
              MCOperand_CreateReg0(instr,uVar5);
              MCOperand_CreateImm0(instr,(long)local_190.displacement);
LAB_0019e726:
              uVar14 = (ulong)local_190.segmentOverride;
              puVar12 = "";
            }
            goto LAB_0019e731;
          case '\t':
            uVar14 = (ulong)local_190.vvvv;
            goto LAB_0019e052;
          case '\n':
            if ((local_190.writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL) {
              return false;
            }
            uVar5 = local_190.writemask + MODRM_REG_XMM6 & 0x5f;
            goto LAB_0019e738;
          default:
            goto switchD_0019df63_caseD_c;
          case '\x11':
          case '\x12':
          case '\x13':
          case '\x14':
          case '\x1a':
          case '\x1b':
            uVar14 = (ulong)local_190.numImmediatesTranslated;
            local_190.numImmediatesTranslated = local_190.numImmediatesTranslated + 1;
            uVar14 = local_190.immediates[uVar14];
            bVar3 = pOVar16->type;
            if (bVar3 < 0x10) {
              if (bVar3 - 0xc < 4) {
LAB_0019dfd4:
                uVar5 = MCInst_getOpcode(instr);
                uVar10 = pOVar16->encoding;
                if (uVar10 == '\x13') {
                  uVar9 = uVar14 | 0xffffffff00000000;
                  bVar17 = (int)uVar14 < 0;
LAB_0019e289:
                  if (bVar17) {
                    uVar14 = uVar9;
                  }
                }
                else {
                  if (uVar10 == '\x12') {
                    uVar9 = uVar14 | 0xffffffffffff0000;
                    bVar17 = (short)uVar14 < 0;
                    goto LAB_0019e289;
                  }
                  if ((uVar10 == '\x11') && ((uVar5 & 0xfffffffb) - 0xbe3 < 0xfffffffe)) {
                    if ((int)uVar5 < 0x79d) {
                      if ((int)uVar5 < 0x2da) {
                        if (((uVar5 != 0xfc) && (uVar5 != 0xfe)) && (uVar5 != 0x2d8))
                        goto LAB_0019e765;
                      }
                      else if ((int)uVar5 < 0x395) {
                        if ((uVar5 != 0x2da) && (uVar5 != 0x390)) goto LAB_0019e765;
                      }
                      else if ((uVar5 != 0x395) && (uVar5 != 0x6df)) goto LAB_0019e765;
                    }
                    else if ((int)uVar5 < 0xf1b) {
                      if ((2 < uVar5 - 0xcf9) && (uVar5 != 0x79d)) {
LAB_0019e765:
                        uVar9 = uVar14 | 0xffffffffffffff00;
                        bVar17 = (char)uVar14 < '\0';
                        goto LAB_0019e289;
                      }
                    }
                    else if (((uVar5 != 0xf1b) && (uVar5 != 0x1181)) && (uVar5 != 0x1268))
                    goto LAB_0019e765;
                  }
                }
LAB_0019e28d:
                uVar5 = (uint)uVar14;
                if (bVar3 < 0x3d) {
                  if (bVar3 - 3 < 2) {
                    uVar6 = 0x80000000;
                    uVar9 = 0xffffffff00000000;
                  }
                  else {
                    if (bVar3 != 1) goto LAB_0019e37b;
                    uVar9 = 0xffffffffffffff00;
                    uVar6 = 0x80;
                  }
                  uVar13 = 0;
                  if ((uVar6 & uVar5) != 0) {
                    uVar13 = uVar9;
                  }
                  uVar14 = uVar13 | uVar14;
                  goto LAB_0019e429;
                }
                if (bVar3 - 0x3d < 3) {
                  uVar5 = (uVar5 >> 4) + 0x72;
                  goto LAB_0019e738;
                }
                if (bVar3 == 0x40) {
                  uVar5 = (uVar5 >> 4) + 0x92;
                  goto LAB_0019e738;
                }
                if (bVar3 != 0x41) {
LAB_0019e37b:
                  MCOperand_CreateImm0(instr,uVar14);
                  if ((byte)(bVar3 - 0x2d) < 4) goto LAB_0019e726;
                  break;
                }
                uVar5 = (uVar5 >> 4) + 0xb2;
                goto LAB_0019e738;
              }
LAB_0019e312:
              if ((uVar14 < 0x20) || (bVar3 != 0x11)) goto LAB_0019e28d;
              uVar6 = MCInst_getOpcode(instr);
              uVar6 = uVar6 - 0xc01;
              uVar5 = 0;
              if (uVar6 < 0x29) {
                puVar11 = &DAT_001eae34;
LAB_0019e343:
                uVar5 = *(uint *)(puVar11 + (ulong)uVar6 * 4);
              }
LAB_0019e346:
              MCInst_setOpcode(instr,uVar5);
            }
            else if (bVar3 == 0x10) {
              if (7 < uVar14) {
                uVar6 = MCInst_getOpcode(instr);
                uVar6 = uVar6 - 0x226;
                uVar5 = 0;
                if (uVar6 < 0x12) {
                  puVar11 = &DAT_001eadec;
                  goto LAB_0019e343;
                }
                goto LAB_0019e346;
              }
            }
            else {
              if (bVar3 == 0x4f) goto LAB_0019dfd4;
              if (bVar3 != 0x50) goto LAB_0019e312;
              if (local_190.displacementSize == '\x04') {
                uVar9 = uVar14 | 0xffffffff00000000;
                bVar17 = (int)uVar14 < 0;
              }
              else if (local_190.displacementSize == '\x02') {
                uVar9 = uVar14 | 0xffffffffffff0000;
                bVar17 = (short)uVar14 < 0;
              }
              else {
                if (local_190.displacementSize != '\x01') goto LAB_0019e429;
                uVar9 = uVar14 | 0xffffffffffffff00;
                bVar17 = (char)uVar14 < '\0';
              }
              if (bVar17) {
                uVar14 = uVar9;
              }
            }
LAB_0019e429:
            MCOperand_CreateImm0(instr,uVar14);
            break;
          case '\x15':
          case '\x16':
          case '\x17':
          case '\x18':
          case '\x1c':
            uVar14 = (ulong)local_190.opcodeRegister;
            goto LAB_0019e052;
          case '\x19':
            uVar5 = (local_190.modRM & 7) + 0x6a;
            goto LAB_0019e738;
          case '\x1d':
            goto switchD_0019df32_caseD_1d;
          case '\x1e':
            bVar3 = local_190.isPrefix67;
            if (local_190.mode == MODE_32BIT) {
LAB_0019e3b1:
              uVar5 = (uint)bVar3 * 0x10 + 0x1d;
            }
            else {
              if (local_190.mode != MODE_64BIT) {
                bVar3 = local_190.isPrefix67 ^ 1;
                goto LAB_0019e3b1;
              }
              uVar5 = 0x2b;
              if (local_190.isPrefix67 != false) {
                uVar5 = 0x1d;
              }
            }
            MCOperand_CreateReg0(instr,uVar5);
            goto LAB_0019e726;
          case '\x1f':
            if (local_190.mode == MODE_32BIT) {
              bVar3 = local_190.isPrefix67 ^ 1;
            }
            else {
              bVar3 = local_190.isPrefix67;
              if (local_190.mode == MODE_64BIT) {
                uVar5 = (uint)(local_190.isPrefix67 ^ 1) * 0x10 + 0x17;
                goto LAB_0019e738;
              }
            }
            uVar5 = (uint)bVar3 + (uint)bVar3 * 8 + 0xe;
            goto LAB_0019e738;
          }
        }
        lVar15 = lVar15 + 1;
        if (lVar15 == 5) {
          instr->imm_size = local_190.immSize;
          if (*(int *)(ud + 0x68) == 0) {
            instr->x86_prefix[0] = local_190.prefix0;
            instr->x86_prefix[1] = local_190.prefix1;
            instr->x86_prefix[2] = local_190.prefix2;
            instr->x86_prefix[3] = local_190.prefix3;
          }
          else {
            pcVar2 = instr->flat_insn;
            instr->x86_prefix[0] = local_190.prefix0;
            instr->x86_prefix[1] = local_190.prefix1;
            instr->x86_prefix[2] = local_190.prefix2;
            instr->x86_prefix[3] = local_190.prefix3;
            if (local_190.vectorExtensionType == TYPE_NO_VEX_XOP) {
              if (local_190.twoByteEscape == '\0') {
                (pcVar2->detail->field_6).x86.opcode[0] = local_190.opcode;
              }
              else {
                (pcVar2->detail->field_6).x86.opcode[0] = local_190.twoByteEscape;
                if (local_190.threeByteEscape == '\0') {
                  (pcVar2->detail->field_6).x86.opcode[1] = local_190.opcode;
                }
                else {
                  (pcVar2->detail->field_6).x86.opcode[1] = local_190.threeByteEscape;
                  (pcVar2->detail->field_6).x86.opcode[2] = local_190.opcode;
                }
              }
            }
            else {
              (pcVar2->detail->field_6).arm.vector_size = (int)local_190.vectorExtensionPrefix;
            }
            (pcVar2->detail->field_6).x86.rex = local_190.rexPrefix;
            (pcVar2->detail->field_6).x86.addr_size = local_190.addressSize;
            (pcVar2->detail->field_6).x86.modrm = local_190.orgModRM;
            (pcVar2->detail->field_6).x86.sib = local_190.sib;
            (pcVar2->detail->field_6).x86.disp = local_190.displacement;
            xVar8 = x86_map_sib_index(local_190.sibIndex);
            (pcVar2->detail->field_6).x86.sib_index = xVar8;
            (pcVar2->detail->field_6).x86.sib_scale = local_190.sibScale;
            xVar8 = x86_map_sib_base(local_190.sibBase);
            (pcVar2->detail->field_6).x86.sib_base = xVar8;
          }
          return true;
        }
      } while( true );
    }
  }
  else {
    *size = (short)local_190.readerCursor - (short)address;
  }
switchD_0019df63_caseD_c:
  return false;
switchD_0019df32_caseD_1d:
  pOVar16 = local_190.operands + ((ulong)pOVar16->type - 0x51);
  uVar10 = pOVar16->encoding;
  goto LAB_0019df1c;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn;
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	memset(&insn, 0, offsetof(InternalInstruction, reader));

	if (instr->flat_insn->detail) {
		instr->flat_insn->detail->x86.op_count = 0;
		instr->flat_insn->detail->x86.sse_cc = X86_SSE_CC_INVALID;
		instr->flat_insn->detail->x86.avx_cc = X86_AVX_CC_INVALID;
		instr->flat_insn->detail->x86.avx_sae = false;
		instr->flat_insn->detail->x86.avx_rm = X86_AVX_RM_INVALID;

		memset(instr->flat_insn->detail->x86.prefix, 0, sizeof(instr->flat_insn->detail->x86.prefix));
		memset(instr->flat_insn->detail->x86.opcode, 0, sizeof(instr->flat_insn->detail->x86.opcode));
		memset(instr->flat_insn->detail->x86.operands, 0, sizeof(instr->flat_insn->detail->x86.operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}